

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O1

QThreadPool * QThreadPool::globalInstance(void)

{
  QBasicAtomicInt *pQVar1;
  QBasicAtomicInt *pQVar2;
  Data *pDVar3;
  QBasicMutex copy;
  bool bVar4;
  QObject *pQVar5;
  Data *pDVar6;
  
  if (globalInstance()::theInstance == '\0') {
    globalInstance();
  }
  if ((AtomicType)globalInstance::theMutex.d_ptr._q_value._M_b._M_p == (AtomicType)0x0) {
    LOCK();
    globalInstance::theMutex.d_ptr._q_value._M_b._M_p =
         (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
    UNLOCK();
  }
  else {
    QBasicMutex::lockInternal(&globalInstance::theMutex);
  }
  if ((((globalInstance::theInstance.wp.d == (Data *)0x0) ||
       (((globalInstance::theInstance.wp.d)->strongref)._q_value.super___atomic_base<int>._M_i == 0)
       ) || (pDVar6 = globalInstance::theInstance.wp.d,
            globalInstance::theInstance.wp.value == (QObject *)0x0)) &&
     (bVar4 = QCoreApplication::closingDown(), pDVar6 = globalInstance::theInstance.wp.d, !bVar4)) {
    pQVar5 = (QObject *)operator_new(0x10);
    QThreadPool((QThreadPool *)pQVar5,(QObject *)0x0);
    pDVar6 = QtSharedPointer::ExternalRefCountData::getAndRef(pQVar5);
    pDVar3 = globalInstance::theInstance.wp.d;
    globalInstance::theInstance.wp.value = pQVar5;
    if (globalInstance::theInstance.wp.d != (Data *)0x0) {
      LOCK();
      pQVar1 = &(globalInstance::theInstance.wp.d)->weakref;
      pQVar2 = &(globalInstance::theInstance.wp.d)->weakref;
      globalInstance::theInstance.wp.d = pDVar6;
      (pQVar2->_q_value).super___atomic_base<int>._M_i =
           (pQVar1->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      pDVar6 = globalInstance::theInstance.wp.d;
      if ((pDVar3->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(pDVar3);
        pDVar6 = globalInstance::theInstance.wp.d;
      }
    }
  }
  globalInstance::theInstance.wp.d = pDVar6;
  copy.d_ptr._q_value._M_b._M_p = globalInstance::theMutex.d_ptr._q_value._M_b._M_p;
  if ((globalInstance::theInstance.wp.d == (Data *)0x0) ||
     (pQVar5 = globalInstance::theInstance.wp.value,
     ((globalInstance::theInstance.wp.d)->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
    pQVar5 = (QObject *)0x0;
  }
  LOCK();
  globalInstance::theMutex.d_ptr._q_value._M_b._M_p =
       (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
  UNLOCK();
  if ((AtomicType)copy.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
    QBasicMutex::unlockInternalFutex
              (&globalInstance::theMutex,(void *)copy.d_ptr._q_value._M_b._M_p);
  }
  return (QThreadPool *)pQVar5;
}

Assistant:

QThreadPool *QThreadPool::globalInstance()
{
    Q_CONSTINIT static QPointer<QThreadPool> theInstance;
    Q_CONSTINIT static QBasicMutex theMutex;

    const QMutexLocker locker(&theMutex);
    if (theInstance.isNull() && !QCoreApplication::closingDown())
        theInstance = new QThreadPool();
    return theInstance;
}